

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QTzTransitionTime>::reallocate
          (QPodArrayOps<QTzTransitionTime> *this,qsizetype alloc,AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  QTzTransitionTime *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QTzTransitionTime>_*,_QTzTransitionTime_*> pVar2;
  pair<QTypedArrayData<QTzTransitionTime>_*,_QTzTransitionTime_*> pair;
  QTzTransitionTime *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<QTzTransitionTime>::reallocateUnaligned
                    ((QTypedArrayData<QTzTransitionTime> *)&DAT_aaaaaaaaaaaaaaaa,in_RDI,in_RSI,
                     in_EDX);
  local_10 = pVar2.second;
  if (local_10 == (QTzTransitionTime *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      qBadAlloc();
    }
  }
  else {
    in_RDI->atMSecsSinceEpoch = (qint64)pVar2.first;
    *(QTzTransitionTime **)&in_RDI->ruleIndex = local_10;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }